

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

UChar * u_strtok_r_63(UChar *src,UChar *delim,UChar **saveState)

{
  uint uVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  UChar *string;
  
  if (src == (UChar *)0x0) {
    src = *saveState;
    if (src == (UChar *)0x0) {
      return (UChar *)0x0;
    }
  }
  else {
    *saveState = src;
  }
  uVar1 = u_strspn_63(src,delim);
  if (src[uVar1] == L'\0') {
    pUVar3 = (UChar *)0x0;
    string = (UChar *)0x0;
  }
  else {
    string = src + uVar1;
    pUVar2 = u_strpbrk_63(string,delim);
    if (pUVar2 == (UChar *)0x0) {
      pUVar3 = (UChar *)0x0;
    }
    else {
      pUVar3 = pUVar2 + 1;
      *pUVar2 = L'\0';
    }
  }
  *saveState = pUVar3;
  return string;
}

Assistant:

U_CAPI UChar* U_EXPORT2
u_strtok_r(UChar    *src, 
     const UChar    *delim,
           UChar   **saveState)
{
    UChar *tokSource;
    UChar *nextToken;
    uint32_t nonDelimIdx;

    /* If saveState is NULL, the user messed up. */
    if (src != NULL) {
        tokSource = src;
        *saveState = src; /* Set to "src" in case there are no delimiters */
    }
    else if (*saveState) {
        tokSource = *saveState;
    }
    else {
        /* src == NULL && *saveState == NULL */
        /* This shouldn't happen. We already finished tokenizing. */
        return NULL;
    }

    /* Skip initial delimiters */
    nonDelimIdx = u_strspn(tokSource, delim);
    tokSource = &tokSource[nonDelimIdx];

    if (*tokSource) {
        nextToken = u_strpbrk(tokSource, delim);
        if (nextToken != NULL) {
            /* Create a token */
            *(nextToken++) = 0;
            *saveState = nextToken;
            return tokSource;
        }
        else if (*saveState) {
            /* Return the last token */
            *saveState = NULL;
            return tokSource;
        }
    }
    else {
        /* No tokens were found. Only delimiters were left. */
        *saveState = NULL;
    }
    return NULL;
}